

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

int amrex::parser_ast_depth(parser_node *node)

{
  parser_node_t pVar1;
  parser_node_t __val;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  int iVar10;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  iVar10 = 0;
LAB_0072440b:
  iVar10 = iVar10 + 1;
  pVar1 = node->type;
  switch(pVar1) {
  case PARSER_NUMBER:
  case PARSER_SYMBOL:
  case PARSER_ADD_VP:
  case PARSER_ADD_PP:
  case PARSER_SUB_VP:
  case PARSER_SUB_PP:
  case PARSER_MUL_VP:
  case PARSER_MUL_PP:
  case PARSER_DIV_VP:
  case PARSER_DIV_PP:
  case PARSER_NEG_P:
    goto switchD_00724421_caseD_1;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_F2:
  case PARSER_LIST:
    iVar3 = parser_ast_depth(node->l);
    iVar4 = parser_ast_depth(node->r);
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    break;
  case PARSER_NEG:
  case PARSER_F1:
    goto switchD_00724421_caseD_7;
  case PARSER_F3:
    iVar3 = parser_ast_depth(node->l);
    iVar4 = parser_ast_depth(node->r);
    iVar5 = parser_ast_depth((node->lvp).n);
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + 1;
    goto LAB_0072442f;
  case PARSER_ASSIGN:
    iVar4 = parser_ast_depth(node->r);
    break;
  default:
    __val = -pVar1;
    if (0 < (int)pVar1) {
      __val = pVar1;
    }
    __len = 1;
    if (__val < PARSER_F3) goto LAB_007244fe;
    uVar9 = (ulong)__val;
    uVar2 = 4;
    goto LAB_00724485;
  }
  return iVar4 + iVar10;
switchD_00724421_caseD_7:
  node = node->l;
  goto LAB_0072440b;
switchD_00724421_caseD_1:
  iVar4 = 1;
  goto LAB_0072442f;
  while( true ) {
    if (uVar7 < 10000) goto LAB_007244fe;
    uVar9 = uVar9 / 10000;
    uVar2 = __len + 4;
    if (uVar7 < 100000) break;
LAB_00724485:
    __len = uVar2;
    uVar7 = (uint)uVar9;
    if (uVar7 < 100) {
      __len = __len - 2;
      goto LAB_007244fe;
    }
    if (uVar7 < 1000) {
      __len = __len - 1;
      goto LAB_007244fe;
    }
  }
  __len = __len + 1;
LAB_007244fe:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)pVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(pVar1 >> 0x1f)),__len,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x779c7f);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Abort(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar4 = 0;
LAB_0072442f:
  return iVar4 + iVar10 + -1;
}

Assistant:

int
parser_ast_depth (struct parser_node* node)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
    case PARSER_SYMBOL:
        return 1;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
    {
        int d1 = parser_ast_depth(node->l);
        int d2 = parser_ast_depth(node->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_NEG:
        return parser_ast_depth(node->l)+1;
    case PARSER_F1:
        return parser_ast_depth(((struct parser_f1*)node)->l) + 1;
    case PARSER_F2:
    {
        int d1 = parser_ast_depth(((struct parser_f2*)node)->l);
        int d2 = parser_ast_depth(((struct parser_f2*)node)->r);
        return std::max(d1,d2)+1;
    }
    case PARSER_F3:
    {
        int d1 = parser_ast_depth(((struct parser_f3*)node)->n1);
        int d2 = parser_ast_depth(((struct parser_f3*)node)->n2);
        int d3 = parser_ast_depth(((struct parser_f3*)node)->n3);
        return std::max({d1,d2,d3})+1;
    }
    case PARSER_ASSIGN:
    {
        int d = parser_ast_depth(((struct parser_assign*)node)->v);
        return d+1;
    }
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
    case PARSER_NEG_P:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        return 1;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
        return 0;
    }
}